

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QVariant * QVariant::moveConstruct(QVariant *__return_storage_ptr__,QMetaType type,void *data)

{
  undefined1 *puVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  PrivateShared *pPVar5;
  void *__dest;
  int iVar6;
  
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(ulong *)&(__return_storage_ptr__->d).field_0x18 = (ulong)type.d_ptr & 0xfffffffffffffffc;
  if (data == (void *)0x0) {
    uVar4 = 2;
  }
  else {
    uVar4 = (ulong)((uint)(((type.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i == 0x33) *
                   2);
  }
  uVar4 = uVar4 | (ulong)type.d_ptr & 0xfffffffffffffffc;
  *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uVar4;
  if (((((type.d_ptr)->flags & 4) == 0) || (uVar3 = (type.d_ptr)->size, 0x18 < uVar3)) ||
     (8 < (type.d_ptr)->alignment)) {
    uVar2 = (type.d_ptr)->alignment;
    uVar4 = 8;
    if (8 < (ulong)uVar2) {
      uVar4 = (ulong)uVar2;
    }
    pPVar5 = (PrivateShared *)operator_new(uVar4 + (type.d_ptr)->size);
    (pPVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int> = (__atomic_base<int>)0x1;
    iVar6 = (-(uint)uVar2 & (int)pPVar5 + (uint)uVar2 + 7) - (int)pPVar5;
    pPVar5->offset = iVar6;
    __dest = (void *)((long)&(pPVar5->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                             _q_value.super___atomic_base<int> + (long)iVar6);
    if ((type.d_ptr)->moveCtr == (MoveCtrFn)0x0) {
      memcpy(__dest,data,(ulong)(type.d_ptr)->size);
    }
    else {
      (*(type.d_ptr)->moveCtr)(type.d_ptr,__dest,data);
    }
    (__return_storage_ptr__->d).data.shared = pPVar5;
    puVar1 = &(__return_storage_ptr__->d).field_0x18;
    *puVar1 = *puVar1 | 1;
  }
  else {
    *(ulong *)&(__return_storage_ptr__->d).field_0x18 = uVar4;
    if ((data != (void *)0x0) || ((type.d_ptr)->defaultCtr != (DefaultCtrFn)0x0)) {
      if ((type.d_ptr)->moveCtr == (MoveCtrFn)0x0) {
        __memcpy_chk(__return_storage_ptr__,data,uVar3,0x20);
      }
      else {
        (*(type.d_ptr)->moveCtr)(type.d_ptr,__return_storage_ptr__,data);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QVariant::moveConstruct(QMetaType type, void *data)
{
    QVariant var;
    var.d = QVariant::Private(type.d_ptr);
    customConstruct<ForceMove, NonNull>(type.d_ptr, &var.d, data);
    return var;
}